

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::set<long_double,std::less<long_double>,std::allocator<long_double>>,void>
               (set<long_double,_std::less<long_double>,_std::allocator<long_double>_> *container,
               ostream *os)

{
  _Base_ptr p_Var1;
  long lVar2;
  _Rb_tree_header *p_Var3;
  char local_35 [5];
  
  local_35[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 2,1);
  p_Var1 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(container->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var3) {
    lVar2 = 0;
    do {
      if (lVar2 != 0) {
        local_35[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,local_35,1);
        if (lVar2 == 0x20) {
          std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
          goto LAB_001d66a4;
        }
      }
      local_35[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 1,1);
      std::ostream::_M_insert<long_double>(*(longdouble *)(p_Var1 + 1));
      lVar2 = lVar2 + 1;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var3);
    if (lVar2 != 0) {
LAB_001d66a4:
      local_35[3] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 3,1);
    }
  }
  local_35[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_35 + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }